

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void __thiscall Js::ScriptContext::InitializePreGlobal(ScriptContext *this)

{
  bool bVar1;
  BackgroundParser *pBVar2;
  NativeCodeGenerator *pNVar3;
  HeapAllocator *alloc;
  JITPageAddrToFuncRangeCache *pJVar4;
  Stack<void_*,_Memory::ArenaAllocator,_false,_DefaultComparer> *pSVar5;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  bVar1 = Phases::IsEnabled((Phases *)&DAT_015c1bd0,ParallelParsePhase);
  if (bVar1) {
    pBVar2 = BackgroundParser::New(this);
    this->backgroundParser = pBVar2;
  }
  pNVar3 = NewNativeCodeGenerator(this);
  this->nativeCodeGen = pNVar3;
  local_48 = (undefined1  [8])&JITPageAddrToFuncRangeCache::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2d86450;
  data.filename._0_4_ = 0x51b;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_48);
  pJVar4 = (JITPageAddrToFuncRangeCache *)new<Memory::HeapAllocator>(0x10,alloc,0x300d4a);
  pJVar4->jitPageAddrToFuncRangeMap = (JITPageAddrToFuncRangeMap *)0x0;
  pJVar4->largeJitFuncToSizeMap = (LargeJITFuncAddrToSizeMap *)0x0;
  this->jitFuncRangeCache = pJVar4;
  CreateProfiler(this);
  pSVar5 = (Stack<void_*,_Memory::ArenaAllocator,_false,_DefaultComparer> *)
           new<Memory::ArenaAllocator>(0x30,&this->generalAllocator,0x366bee);
  (pSVar5->list).super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>.buffer =
       (Type)0x0;
  (pSVar5->list).super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>.count = 0;
  (pSVar5->list).super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>.alloc =
       &this->generalAllocator;
  (pSVar5->list).super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014f1568;
  (pSVar5->list).length = 0;
  (pSVar5->list).increment = 4;
  this->operationStack = pSVar5;
  return;
}

Assistant:

void ScriptContext::InitializePreGlobal()
    {
#if ENABLE_BACKGROUND_PARSING
        if (PHASE_ON1(Js::ParallelParsePhase))
        {
            this->backgroundParser = BackgroundParser::New(this);
        }
#endif

#if ENABLE_NATIVE_CODEGEN
        // Create the native code gen before the profiler
        this->nativeCodeGen = NewNativeCodeGenerator(this);
        this->jitFuncRangeCache = HeapNew(JITPageAddrToFuncRangeCache);
#endif

#ifdef PROFILE_EXEC
        this->CreateProfiler();
#endif

        this->operationStack = Anew(GeneralAllocator(), JsUtil::Stack<Var>, GeneralAllocator());
    }